

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackRPMGenerator.cxx
# Opt level: O0

int __thiscall
cmCPackRPMGenerator::PackageOnePack
          (cmCPackRPMGenerator *this,string *initialToplevel,string *packageName)

{
  cmCPackLog *this_00;
  bool bVar1;
  int iVar2;
  char *pcVar3;
  undefined4 extraout_var;
  ostream *this_01;
  string local_3c8 [32];
  undefined1 local_3a8 [8];
  ostringstream cmCPackLog_msg;
  allocator local_229;
  string local_228;
  allocator local_201;
  string local_200 [8];
  string component_path;
  string local_1d8;
  allocator local_1b1;
  string local_1b0;
  allocator local_189;
  string local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  allocator local_141;
  string local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  allocator local_fa;
  allocator local_f9;
  string local_f8;
  string local_d8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  undefined1 local_98 [8];
  string outputFileName;
  undefined1 local_68 [8];
  string packageFileName;
  string localToplevel;
  int retval;
  string *packageName_local;
  string *initialToplevel_local;
  cmCPackRPMGenerator *this_local;
  
  std::__cxx11::string::string
            ((string *)(packageFileName.field_2._M_local_buf + 8),(string *)initialToplevel);
  cmsys::SystemTools::GetParentDirectory
            ((string *)local_68,&(this->super_cmCPackGenerator).toplevel);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f8,"CPACK_PACKAGE_FILE_NAME",&local_f9);
  pcVar3 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,pcVar3,&local_fa);
  (*(this->super_cmCPackGenerator).super_cmObject._vptr_cmObject[9])
            (&local_b8,this,local_d8,packageName,1);
  iVar2 = (*(this->super_cmCPackGenerator).super_cmObject._vptr_cmObject[5])();
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                 &local_b8,(char *)CONCAT44(extraout_var,iVar2));
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_fa);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  std::operator+(&local_120,"/",packageName);
  std::__cxx11::string::operator+=
            ((string *)(packageFileName.field_2._M_local_buf + 8),(string *)&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_140,"CPACK_TEMPORARY_DIRECTORY",&local_141);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,&local_140,pcVar3);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  std::operator+(&local_168,"/",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98);
  std::__cxx11::string::operator+=((string *)local_68,(string *)&local_168);
  std::__cxx11::string::~string((string *)&local_168);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_188,"CPACK_OUTPUT_FILE_NAME",&local_189);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,&local_188,pcVar3);
  std::__cxx11::string::~string((string *)&local_188);
  std::allocator<char>::~allocator((allocator<char> *)&local_189);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1b0,"CPACK_TEMPORARY_PACKAGE_FILE_NAME",&local_1b1);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,&local_1b0,pcVar3);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1d8,"CPACK_RPM_PACKAGE_COMPONENT",
             (allocator *)(component_path.field_2._M_local_buf + 0xf));
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,&local_1d8,pcVar3);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator((allocator<char> *)(component_path.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_200,"/",&local_201);
  std::allocator<char>::~allocator((allocator<char> *)&local_201);
  std::__cxx11::string::operator+=(local_200,(string *)packageName);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_228,"CPACK_RPM_PACKAGE_COMPONENT_PART_PATH",&local_229);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,&local_228,pcVar3);
  std::__cxx11::string::~string((string *)&local_228);
  std::allocator<char>::~allocator((allocator<char> *)&local_229);
  bVar1 = cmCPackGenerator::ReadListFile(&this->super_cmCPackGenerator,"CPackRPM.cmake");
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3a8);
    this_01 = std::operator<<((ostream *)local_3a8,"Error while execution CPackRPM.cmake");
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
    this_00 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::ostringstream::str();
    pcVar3 = (char *)std::__cxx11::string::c_str();
    cmCPackLog::Log(this_00,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackRPMGenerator.cxx"
                    ,0x58,pcVar3);
    std::__cxx11::string::~string(local_3c8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3a8);
  }
  localToplevel.field_2._13_3_ = 0;
  localToplevel.field_2._M_local_buf[0xc] = bVar1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&(this->super_cmCPackGenerator).packageFileNames,(value_type *)local_68);
  std::__cxx11::string::~string(local_200);
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)(packageFileName.field_2._M_local_buf + 8));
  return localToplevel.field_2._12_4_;
}

Assistant:

int cmCPackRPMGenerator::PackageOnePack(std::string initialToplevel,
                                        std::string packageName)
{
  int retval = 1;
  // Begin the archive for this pack
  std::string localToplevel(initialToplevel);
  std::string packageFileName(
      cmSystemTools::GetParentDirectory(toplevel)
                             );
  std::string outputFileName(
   GetComponentPackageFileName(this->GetOption("CPACK_PACKAGE_FILE_NAME"),
                               packageName,
                               true)
                               + this->GetOutputExtension()
                            );

  localToplevel += "/"+ packageName;
  /* replace the TEMP DIRECTORY with the component one */
  this->SetOption("CPACK_TEMPORARY_DIRECTORY",localToplevel.c_str());
  packageFileName += "/"+ outputFileName;
  /* replace proposed CPACK_OUTPUT_FILE_NAME */
  this->SetOption("CPACK_OUTPUT_FILE_NAME",outputFileName.c_str());
  /* replace the TEMPORARY package file name */
  this->SetOption("CPACK_TEMPORARY_PACKAGE_FILE_NAME",
                  packageFileName.c_str());
  // Tell CPackRPM.cmake the name of the component NAME.
  this->SetOption("CPACK_RPM_PACKAGE_COMPONENT",packageName.c_str());
  // Tell CPackRPM.cmake the path where the component is.
  std::string component_path = "/";
  component_path += packageName;
  this->SetOption("CPACK_RPM_PACKAGE_COMPONENT_PART_PATH",
                  component_path.c_str());
  if (!this->ReadListFile("CPackRPM.cmake"))
    {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
        "Error while execution CPackRPM.cmake" << std::endl);
    retval = 0;
    }
  // add the generated package to package file names list
  packageFileNames.push_back(packageFileName);
  return retval;
}